

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void spr_write_excp_vector(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  int iVar1;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  iVar1 = -400;
  if ((((sprn & 0xfffffff0U) != 400) && (iVar1 = -0x1f0, 5 < sprn - 0x210U)) &&
     (iVar1 = -0x18a, 4 < sprn - 0x1b0U)) {
    printf("Trying to write an unknown exception vector %d %03x\n",sprn,sprn);
    gen_inval_exception(ctx,2);
    return;
  }
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_ld_i64_ppc64(tcg_ctx,ret,tcg_ctx->cpu_env,0x132f0);
  tcg_gen_and_i64_ppc64(tcg_ctx,ret,ret,cpu_gpr[gprn]);
  tcg_gen_st_i64_ppc64(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(uint)(iVar1 + sprn) * 8 + 0x12fb8);
  gen_store_spr(tcg_ctx,sprn,ret);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void spr_write_excp_vector(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int sprn_offs;

    if (sprn >= SPR_BOOKE_IVOR0 && sprn <= SPR_BOOKE_IVOR15) {
        sprn_offs = sprn - SPR_BOOKE_IVOR0;
    } else if (sprn >= SPR_BOOKE_IVOR32 && sprn <= SPR_BOOKE_IVOR37) {
        sprn_offs = sprn - SPR_BOOKE_IVOR32 + 32;
    } else if (sprn >= SPR_BOOKE_IVOR38 && sprn <= SPR_BOOKE_IVOR42) {
        sprn_offs = sprn - SPR_BOOKE_IVOR38 + 38;
    } else {
        printf("Trying to write an unknown exception vector %d %03x\n",
               sprn, sprn);
        gen_inval_exception(ctx, POWERPC_EXCP_PRIV_REG);
        return;
    }

    TCGv t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_ld_tl(tcg_ctx, t0, tcg_ctx->cpu_env, offsetof(CPUPPCState, ivor_mask));
    tcg_gen_and_tl(tcg_ctx, t0, t0, cpu_gpr[gprn]);
    tcg_gen_st_tl(tcg_ctx, t0, tcg_ctx->cpu_env, offsetof(CPUPPCState, excp_vectors[sprn_offs]));
    gen_store_spr(tcg_ctx, sprn, t0);
    tcg_temp_free(tcg_ctx, t0);
}